

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

int cargo_add_optionv(cargo_t ctx,cargo_option_flags_t flags,char *optnames,char *description,
                     char *fmt,__va_list_tag *ap)

{
  byte bVar1;
  char cVar2;
  uint uVar3;
  bool bVar4;
  int iVar5;
  cargo_bool_acc_op_t cVar6;
  cargo_type_t cVar7;
  size_t sVar8;
  char *pcVar9;
  char **ppcVar10;
  char *pcVar11;
  char *pcVar12;
  char *group;
  cargo_t group_00;
  cargo_opt_t *pcVar13;
  uint *puVar14;
  undefined8 *puVar15;
  long lVar16;
  int *piVar17;
  size_t sVar18;
  byte bVar19;
  size_t **ppsVar20;
  undefined4 *puVar21;
  char *fmt_1;
  byte *pbVar22;
  byte *pbVar23;
  ulong uVar24;
  int iVar25;
  size_t *count;
  ulong uVar26;
  cargo_opt_t *o;
  char ***s;
  size_t sVar27;
  size_t optcount;
  char **optname_list;
  size_t local_78;
  cargo_t local_70;
  byte *local_68;
  char **local_60;
  char **local_58;
  char *local_50;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  local_78 = 0;
  local_60 = (char **)0x0;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1728,
                  "int cargo_add_optionv(cargo_t, cargo_option_flags_t, const char *, const char *, const char *, struct __va_list_tag *)"
                 );
  }
  if (((ctx->flags & CARGO_DEFAULT_LITERALS) != 0 || (flags & CARGO_OPT_DEFAULT_LITERAL) != 0) &&
      (ctx->flags & CARGO_AUTOCLEAN) == 0) {
    return -1;
  }
  local_68 = (byte *)fmt;
  local_38 = description;
  sVar8 = strspn(optnames," \t");
  pcVar11 = optnames + sVar8;
  if (optnames[sVar8] == '<') {
    local_40 = strchr(pcVar11,0x3e);
    if (local_40 == (char *)0x0) {
      return -1;
    }
    local_40 = local_40 + ~(ulong)pcVar11;
    pcVar9 = cargo_strndup(pcVar11 + 1,(long)(int)local_40);
    if (pcVar9 == (char *)0x0) {
      return -1;
    }
    local_70 = ctx;
    ppcVar10 = _cargo_split(pcVar9,",",&local_48);
    local_58 = ppcVar10;
    if (local_48 < 3 && ppcVar10 != (char **)0x0) {
      group_00 = (cargo_t)0x0;
      group = (char *)0x0;
      local_50 = pcVar9;
      if (local_48 != 0) {
        uVar24 = 0;
        do {
          pcVar9 = ppcVar10[uVar24];
          sVar8 = strspn(pcVar9," \t");
          if (pcVar9[sVar8] == '!') {
            group = _cargo_strdup(pcVar9 + sVar8 + 1);
            if (group == (char *)0x0) {
              group = (char *)0x0;
LAB_00108b14:
              pcVar11 = (char *)0x0;
              pcVar9 = local_50;
              goto LAB_00108b1b;
            }
          }
          else {
            group_00 = (cargo_t)_cargo_strdup(pcVar9 + sVar8);
            if (group_00 == (cargo_t)0x0) {
              group_00 = (cargo_t)0x0;
              goto LAB_00108b14;
            }
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 < local_48);
      }
      pcVar11 = pcVar11 + (((long)local_40 << 0x20) + 0x200000000 >> 0x20);
      pcVar9 = local_50;
    }
    else {
      group_00 = (cargo_t)0x0;
      group = (char *)0x0;
      pcVar11 = (char *)0x0;
    }
LAB_00108b1b:
    ctx = local_70;
    iVar5 = -1;
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(pcVar9);
    }
    else {
      (*replaced_cargo_free)(pcVar9);
    }
    if (pcVar11 == (char *)0x0) {
      if (group_00 != (cargo_t)0x0) {
        if (replaced_cargo_free == (cargo_free_f)0x0) {
          free(group_00);
        }
        else {
          (*replaced_cargo_free)(group_00);
        }
      }
      if (group != (char *)0x0) {
        if (replaced_cargo_free == (cargo_free_f)0x0) {
          free(group);
        }
        else {
          (*replaced_cargo_free)(group);
        }
      }
      s = &local_58;
      count = &local_48;
      goto LAB_001089da;
    }
    _cargo_free_str_list(&local_58,&local_48);
  }
  else {
    group = (char *)0x0;
    group_00 = (cargo_t)0x0;
  }
  pcVar11 = _cargo_strdup(pcVar11);
  if (pcVar11 == (char *)0x0) {
LAB_00108987:
    local_60 = (char **)0x0;
    goto LAB_00108990;
  }
  ppcVar10 = _cargo_split(pcVar11," ",&local_78);
  local_58 = ppcVar10;
  if ((((ppcVar10 == (char **)0x0) || (local_78 == 0)) ||
      (iVar5 = _cargo_find_option_name(ctx,*ppcVar10,(size_t *)0x0,(size_t *)0x0), iVar5 == 0)) ||
     (((pcVar9 = *ppcVar10, pcVar9 == (char *)0x0 ||
       (pcVar12 = strpbrk(pcVar9,ctx->prefix), pcVar12 != pcVar9)) &&
      (pcVar12 = strpbrk(pcVar9,"abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"),
      pcVar12 != pcVar9)))) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(pcVar11);
    }
    else {
      (*replaced_cargo_free)(pcVar11);
    }
    _cargo_free_str_list(&local_58,&local_78);
    goto LAB_00108987;
  }
  if (replaced_cargo_free == (cargo_free_f)0x0) {
    free(pcVar11);
  }
  else {
    (*replaced_cargo_free)(pcVar11);
  }
  sVar27 = ctx->max_opts;
  local_60 = ppcVar10;
  if (sVar27 == 0) {
    __assert_fail("*max_opts > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x44d,"int _cargo_grow_options(cargo_t, cargo_opt_t **, size_t *, size_t *)");
  }
  pcVar11 = *ppcVar10;
  pcVar13 = ctx->options;
  if (pcVar13 == (cargo_opt_t *)0x0) {
    pcVar13 = (cargo_opt_t *)_cargo_calloc(sVar27,0x128);
    ctx->options = pcVar13;
    if (pcVar13 != (cargo_opt_t *)0x0) {
      sVar27 = ctx->max_opts;
      goto LAB_00108ad1;
    }
    goto LAB_00108990;
  }
LAB_00108ad1:
  uVar24 = ctx->opt_count;
  if (sVar27 <= uVar24) {
    ctx->max_opts = sVar27 * 2;
    if (replaced_cargo_realloc == (cargo_realloc_f)0x0) {
      pcVar13 = (cargo_opt_t *)realloc(pcVar13,sVar27 * 0x250);
    }
    else {
      pcVar13 = (cargo_opt_t *)(*replaced_cargo_realloc)(pcVar13,sVar27 * 0x250);
    }
    if (pcVar13 == (cargo_opt_t *)0x0) goto LAB_00108990;
    ctx->options = pcVar13;
    uVar24 = ctx->opt_count;
    if (uVar24 == 0) {
      uVar24 = 0;
    }
    else {
      ppsVar20 = &pcVar13->target_count;
      uVar26 = uVar24;
      do {
        if ((cargo_custom_f)ppsVar20[-7] != (cargo_custom_f)0x0) {
          ppsVar20[-2] = (size_t *)(ppsVar20 + -4);
          *ppsVar20 = (size_t *)(ppsVar20 + -3);
        }
        ppsVar20 = ppsVar20 + 0x25;
        uVar26 = uVar26 - 1;
      } while (uVar26 != 0);
    }
  }
  pcVar13 = pcVar13 + uVar24;
  o = (cargo_opt_t *)0x0;
  memset(pcVar13,0,0x128);
  ctx->opt_count = ctx->opt_count + 1;
  pcVar11 = _cargo_strdup(pcVar11);
  iVar5 = -1;
  if (pcVar11 == (char *)0x0) goto LAB_00108996;
  sVar27 = pcVar13->name_count;
  pcVar13->name[sVar27] = pcVar11;
  pcVar13->name_count = sVar27 + 1;
  if (local_38 != (char *)0x0) {
    pcVar11 = _cargo_strdup(local_38);
    pcVar13->description = pcVar11;
    if (pcVar11 == (char *)0x0) goto LAB_00108996;
  }
  local_70 = group_00;
  if (group_00 != (cargo_t)0x0) {
    o = (cargo_opt_t *)ctx->groups;
    iVar5 = _cargo_group_add_option_ex
                      (ctx,(cargo_group_t *)o,ctx->group_count,(char *)group_00,pcVar13->name[0],0);
    if (iVar5 == 0) goto LAB_00108c97;
    goto LAB_001093d0;
  }
  pcVar13->group_index = -1;
LAB_00108c97:
  if (group != (char *)0x0) {
    o = (cargo_opt_t *)ctx->mutex_groups;
    iVar5 = _cargo_group_add_option_ex
                      (ctx,(cargo_group_t *)o,ctx->mutex_group_count,group,pcVar13->name[0],1);
    if (iVar5 != 0) goto LAB_001093d0;
  }
  iVar5 = 2;
  pbVar23 = local_68;
  while( true ) {
    pbVar22 = pbVar23 + 1;
    bVar1 = *pbVar23;
    if ((bVar1 != 0x20) && (bVar1 != 9)) break;
    iVar5 = iVar5 + 1;
    pbVar23 = pbVar22;
  }
  if (bVar1 == 0x2e) {
    pcVar13->alloc = 0;
    pbVar23 = pbVar22;
    while( true ) {
      pbVar22 = pbVar23 + 1;
      bVar19 = *pbVar23;
      if ((bVar19 != 0x20) && (bVar19 != 9)) break;
      iVar5 = iVar5 + 1;
      pbVar23 = pbVar22;
    }
  }
  else {
    iVar5 = iVar5 + -1;
    pcVar13->alloc = 1;
    bVar19 = bVar1;
  }
  if (bVar19 == 0x5b) {
    pcVar13->array = 1;
    pbVar23 = pbVar22;
    do {
      do {
        iVar5 = iVar5 + 1;
        pbVar22 = pbVar23 + 1;
        bVar19 = *pbVar23;
        pbVar23 = pbVar22;
      } while (bVar19 == 0x20);
    } while (bVar19 == 9);
  }
  if (bVar19 < 0x62) {
    if (bVar19 != 0x44) {
      if (bVar19 == 0x4c) {
        pcVar13->type = CARGO_LONGLONG;
      }
      else {
        if (bVar19 != 0x55) goto switchD_00108d5a_caseD_65;
        pcVar13->type = CARGO_ULONGLONG;
      }
      goto LAB_00108e7d;
    }
    pcVar13->array = 0;
    pcVar13->alloc = 1;
    pcVar13->type = CARGO_STRING;
    pcVar13->nargs = 0;
    pcVar13->lenstr = 0;
    pcVar13->custom = (cargo_custom_f)0x0;
    pcVar13->custom_user = (void *)0x0;
    pcVar13->target = &pcVar13->custom_target;
    pcVar13->target_count = &pcVar13->custom_target_count;
LAB_0010922b:
    bVar4 = false;
    goto LAB_00108eb1;
  }
  iVar25 = iVar5;
  switch(bVar19) {
  case 0x62:
    pcVar13->type = CARGO_BOOL;
    uVar3 = ap->gp_offset;
    if ((ulong)uVar3 < 0x29) {
      puVar15 = (undefined8 *)((ulong)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      puVar15 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar15 + 1;
    }
    pcVar13->target = (void **)*puVar15;
    pbVar23 = pbVar22;
    do {
      do {
        iVar25 = iVar25 + 1;
        pbVar22 = pbVar23 + 1;
        bVar1 = *pbVar23;
        pbVar23 = pbVar22;
      } while (bVar1 == 0x20);
    } while (bVar1 == 9);
    if (bVar1 < 0x3d) {
      if (bVar1 == 0x21) {
        pcVar13->bool_count = 1;
LAB_00109473:
        bVar4 = true;
        o = (cargo_opt_t *)ap;
        iVar5 = iVar25;
        goto LAB_00108eb1;
      }
      if (bVar1 == 0x26) {
        cVar6 = CARGO_BOOL_OP_AND;
      }
      else {
        if (bVar1 != 0x2b) {
LAB_00109481:
          pcVar13->bool_store = 1;
          pcVar13->bool_count = 0;
          pcVar13->bool_acc = (int *)0x0;
          goto LAB_00109497;
        }
        cVar6 = CARGO_BOOL_OP_PLUS;
      }
LAB_001094ae:
      pcVar13->bool_acc_op = cVar6;
      pcVar13->bool_acc_count = 0;
      uVar3 = ap->gp_offset;
      if ((ulong)uVar3 < 0x29) {
        puVar14 = (uint *)((ulong)uVar3 + (long)ap->reg_save_area);
        ap->gp_offset = uVar3 + 8;
      }
      else {
        puVar14 = (uint *)ap->overflow_arg_area;
        ap->overflow_arg_area = puVar14 + 2;
      }
      uVar3 = *puVar14;
      pcVar13->bool_acc_max_count = (ulong)uVar3;
      o = (cargo_opt_t *)0x4;
      piVar17 = (int *)_cargo_calloc((ulong)uVar3,4);
      pcVar13->bool_acc = piVar17;
      if (piVar17 == (int *)0x0) goto LAB_001093d0;
      if (pcVar13->bool_acc_max_count != 0) {
        uVar24 = 0;
        do {
          uVar3 = ap->gp_offset;
          if ((ulong)uVar3 < 0x29) {
            puVar21 = (undefined4 *)((ulong)uVar3 + (long)ap->reg_save_area);
            ap->gp_offset = uVar3 + 8;
          }
          else {
            puVar21 = (undefined4 *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar21 + 2;
          }
          o = (cargo_opt_t *)pcVar13->bool_acc;
          *(undefined4 *)((long)o->name + uVar24 * 4) = *puVar21;
          uVar24 = uVar24 + 1;
        } while (uVar24 < pcVar13->bool_acc_max_count);
      }
    }
    else {
      if (bVar1 == 0x7c) {
        cVar6 = CARGO_BOOL_OP_OR;
        goto LAB_001094ae;
      }
      if (bVar1 == 0x5f) {
        cVar6 = CARGO_BOOL_OP_STORE;
        goto LAB_001094ae;
      }
      if (bVar1 != 0x3d) goto LAB_00109481;
      uVar3 = ap->gp_offset;
      if ((ulong)uVar3 < 0x29) {
        piVar17 = (int *)((ulong)uVar3 + (long)ap->reg_save_area);
        ap->gp_offset = uVar3 + 8;
      }
      else {
        piVar17 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar17 + 2;
      }
      pcVar13->bool_store = *piVar17;
      o = (cargo_opt_t *)ap;
    }
    bVar4 = true;
    iVar5 = iVar25;
    goto LAB_00108eb1;
  case 99:
    if (bVar1 == 0x2e) {
      pcVar13->alloc = 1;
    }
    pcVar13->type = CARGO_STRING;
    uVar3 = ap->gp_offset;
    if ((ulong)uVar3 < 0x29) {
      puVar15 = (undefined8 *)((ulong)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      puVar15 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar15 + 1;
    }
    pcVar13->custom = (cargo_custom_f)*puVar15;
    uVar3 = ap->gp_offset;
    if ((ulong)uVar3 < 0x29) {
      puVar15 = (undefined8 *)((ulong)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      puVar15 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar15 + 1;
    }
    pcVar13->custom_user = (void *)*puVar15;
    pcVar13->target = &pcVar13->custom_target;
    pcVar13->target_count = &pcVar13->custom_target_count;
    pcVar13->lenstr = 0;
    pbVar23 = pbVar22;
    do {
      do {
        iVar25 = iVar25 + 1;
        pbVar22 = pbVar23 + 1;
        bVar1 = *pbVar23;
        pbVar23 = pbVar22;
      } while (bVar1 == 9);
    } while (bVar1 == 0x20);
    if (bVar1 != 0x30) {
      pbVar22 = local_68 + iVar5;
      pcVar13->nargs = 1;
      o = (cargo_opt_t *)ap;
      goto LAB_0010922b;
    }
    pcVar13->nargs = 0;
    bVar4 = false;
    o = (cargo_opt_t *)ap;
    iVar5 = iVar25;
    goto LAB_00108eb1;
  case 100:
    pcVar13->type = CARGO_DOUBLE;
    break;
  case 0x65:
  case 0x67:
  case 0x68:
    goto switchD_00108d5a_caseD_65;
  case 0x66:
    pcVar13->type = CARGO_FLOAT;
    break;
  case 0x69:
    pcVar13->type = CARGO_INT;
    break;
  default:
    if (bVar19 != 0x73) {
      if (bVar19 == 0x75) {
        pcVar13->type = CARGO_UINT;
        break;
      }
      goto switchD_00108d5a_caseD_65;
    }
    pcVar13->type = CARGO_STRING;
    uVar3 = ap->gp_offset;
    if ((ulong)uVar3 < 0x29) {
      puVar15 = (undefined8 *)((ulong)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      puVar15 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar15 + 1;
    }
    pcVar13->target = (void **)*puVar15;
    pbVar23 = pbVar22;
    do {
      do {
        iVar25 = iVar25 + 1;
        pbVar22 = pbVar23 + 1;
        bVar1 = *pbVar23;
        pbVar23 = pbVar22;
      } while (bVar1 == 0x20);
    } while (bVar1 == 9);
    if (bVar1 == 0x23) {
      uVar3 = ap->gp_offset;
      if ((ulong)uVar3 < 0x29) {
        piVar17 = (int *)((ulong)uVar3 + (long)ap->reg_save_area);
        ap->gp_offset = uVar3 + 8;
      }
      else {
        piVar17 = (int *)ap->overflow_arg_area;
        ap->overflow_arg_area = piVar17 + 2;
      }
      pcVar13->lenstr = (long)*piVar17;
      goto LAB_00109473;
    }
    pcVar13->lenstr = 0;
LAB_00109497:
    pbVar22 = local_68 + iVar5;
    goto LAB_00108ead;
  }
LAB_00108e7d:
  uVar3 = ap->gp_offset;
  if ((ulong)uVar3 < 0x29) {
    puVar15 = (undefined8 *)((ulong)uVar3 + (long)ap->reg_save_area);
    ap->gp_offset = uVar3 + 8;
  }
  else {
    puVar15 = (undefined8 *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar15 + 1;
  }
  pcVar13->target = (void **)*puVar15;
LAB_00108ead:
  bVar4 = true;
  o = (cargo_opt_t *)ap;
LAB_00108eb1:
  if (pcVar13->array == 0) {
    cVar7 = pcVar13->type;
    pbVar23 = pbVar22;
    if (cVar7 == CARGO_BOOL) {
      pcVar13->nargs = 0;
      iVar5 = 0;
    }
    else {
      do {
        do {
          pbVar22 = pbVar23 + 1;
          bVar1 = *pbVar23;
          pbVar23 = pbVar22;
        } while (bVar1 == 0x20);
      } while (bVar1 == 9);
      if (bVar1 == 0x3f) {
        pcVar13->nargs = -3;
        uVar3 = ap->gp_offset;
        if ((ulong)uVar3 < 0x29) {
          puVar15 = (undefined8 *)((ulong)uVar3 + (long)ap->reg_save_area);
          ap->gp_offset = uVar3 + 8;
        }
        else {
          puVar15 = (undefined8 *)ap->overflow_arg_area;
          ap->overflow_arg_area = puVar15 + 1;
        }
        pcVar13->zero_or_one_default = (char *)*puVar15;
        cVar7 = pcVar13->type;
      }
      else {
        pbVar22 = local_68 + iVar5;
        if (bVar4) {
          pcVar13->nargs = 1;
        }
      }
      iVar5 = 0;
      if (cVar7 == CARGO_STRING) {
        iVar5 = pcVar13->alloc;
      }
    }
    pcVar13->alloc = iVar5;
    pcVar13->max_target_count = 1;
    goto LAB_00109306;
  }
  uVar3 = ap->gp_offset;
  if (pcVar13->custom == (cargo_custom_f)0x0) {
    if (uVar3 < 0x29) {
      puVar15 = (undefined8 *)((ulong)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      puVar15 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar15 + 1;
    }
    lVar16 = 0xb8;
  }
  else {
    if (uVar3 < 0x29) {
      puVar15 = (undefined8 *)((long)ap->reg_save_area + (ulong)uVar3);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      puVar15 = (undefined8 *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar15 + 1;
    }
    lVar16 = 0x90;
  }
  *(undefined8 *)((long)pcVar13->name + lVar16) = *puVar15;
  for (pbVar22 = pbVar22 + 2; (bVar1 = pbVar22[-2], bVar1 == 9 || (bVar1 == 0x20));
      pbVar22 = pbVar22 + 1) {
  }
  if (bVar1 == 0x5d) {
    for (; (bVar1 = pbVar22[-1], bVar1 == 0x20 || (bVar1 == 9)); pbVar22 = pbVar22 + 1) {
    }
    if (pcVar13->alloc != 0) {
      if (bVar1 < 0x2b) {
        if (bVar1 == 0x23) {
LAB_00109085:
          uVar3 = ap->gp_offset;
          if ((ulong)uVar3 < 0x29) {
            puVar14 = (uint *)((ulong)uVar3 + (long)ap->reg_save_area);
            ap->gp_offset = uVar3 + 8;
          }
          else {
            puVar14 = (uint *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar14 + 2;
          }
          uVar3 = *puVar14;
          pcVar13->nargs = uVar3;
          uVar24 = 0xffffffffffffffff;
          if (-1 < (int)uVar3) {
            uVar24 = (ulong)uVar3;
          }
        }
        else {
          iVar5 = -2;
          if (bVar1 != 0x2a) goto switchD_00108d5a_caseD_65;
LAB_00109032:
          pcVar13->nargs = iVar5;
          uVar24 = 0xffffffffffffffff;
        }
        pcVar13->max_target_count = uVar24;
        o = (cargo_opt_t *)ap;
        goto LAB_00109306;
      }
      if (bVar1 == 0x4e) goto LAB_00109085;
      if (bVar1 == 0x2b) {
        iVar5 = -1;
        goto LAB_00109032;
      }
switchD_00108d5a_caseD_65:
      if (pcVar13->name[0] == (char *)0x0) {
        __assert_fail("optname",
                      "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                      ,0x1087,
                      "void _cargo_invalid_format_char(cargo_t, const char *, const char *, cargo_fmt_scanner_t *)"
                     );
      }
      goto LAB_001093d0;
    }
    if (*local_68 != 0x2e) {
      __assert_fail("*fmt == \'.\'",
                    "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                    ,0x1860,
                    "int cargo_add_optionv(cargo_t, cargo_option_flags_t, const char *, const char *, const char *, struct __va_list_tag *)"
                   );
    }
    uVar3 = ap->gp_offset;
    if ((ulong)uVar3 < 0x29) {
      piVar17 = (int *)((ulong)uVar3 + (long)ap->reg_save_area);
      ap->gp_offset = uVar3 + 8;
    }
    else {
      piVar17 = (int *)ap->overflow_arg_area;
      ap->overflow_arg_area = piVar17 + 2;
    }
    iVar5 = *piVar17;
    pcVar13->max_target_count = (long)iVar5;
    if (bVar1 < 0x2b) {
      if (bVar1 == 0x23) {
LAB_001090ea:
        pcVar13->nargs = iVar5;
        o = (cargo_opt_t *)ap;
      }
      else {
        if (bVar1 != 0x2a) goto switchD_00108d5a_caseD_65;
        pcVar13->nargs = -2;
        o = (cargo_opt_t *)ap;
      }
    }
    else {
      if (bVar1 != 0x2b) {
        if (bVar1 != 0x4e) goto switchD_00108d5a_caseD_65;
        goto LAB_001090ea;
      }
      pcVar13->nargs = -1;
      o = (cargo_opt_t *)ap;
    }
LAB_00109306:
    for (; (bVar1 = *pbVar22, bVar1 == 9 || (bVar1 == 0x20)); pbVar22 = pbVar22 + 1) {
    }
    if (bVar1 != 0) goto switchD_00108d5a_caseD_65;
    pcVar13->flags = flags;
    pcVar13->first_parse = 1;
    cVar2 = *pcVar13->name[0];
    pcVar11 = ctx->prefix;
    sVar8 = strlen(pcVar11);
    if (sVar8 != 0) {
      sVar18 = 0;
      do {
        if (pcVar11[sVar18] == cVar2) {
          pcVar13->positional = (uint)(cVar2 == '\0');
          if (((flags & CARGO_OPT_NOT_REQUIRED) != 0) || (cVar2 != '\0')) goto LAB_001093c4;
          goto LAB_001093ac;
        }
        sVar18 = sVar18 + 1;
      } while (sVar8 != sVar18);
    }
    pcVar13->positional = 1;
    if ((flags & CARGO_OPT_NOT_REQUIRED) == 0) {
LAB_001093ac:
      if (1 < pcVar13->nargs + 3U) {
        pcVar13->flags = flags | CARGO_OPT_REQUIRED;
      }
    }
LAB_001093c4:
    iVar5 = _cargo_validate_option_args((cargo_t)pcVar13,o);
    ppcVar10 = local_60;
    if (iVar5 != 0) goto LAB_001093d0;
    if ((((pcVar13->type == CARGO_STRING) && (pcVar13->nargs != 1)) && (pcVar13->lenstr == 0)) &&
       (pcVar13->alloc == 0)) {
      pcVar13->str_alloc_items = 1;
    }
    if (1 < local_78) {
      uVar24 = 1;
      do {
        iVar5 = cargo_add_alias(ctx,*ppcVar10,ppcVar10[uVar24]);
        if (iVar5 != 0) goto LAB_001093d0;
        uVar24 = uVar24 + 1;
      } while (uVar24 < local_78);
    }
    iVar5 = 0;
    group_00 = local_70;
  }
  else {
LAB_001093d0:
    _cargo_option_destroy(pcVar13);
    ctx->opt_count = ctx->opt_count - 1;
    group_00 = local_70;
LAB_00108990:
    iVar5 = -1;
  }
LAB_00108996:
  if (group_00 != (cargo_t)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(group_00);
    }
    else {
      (*replaced_cargo_free)(group_00);
    }
  }
  if (group != (char *)0x0) {
    if (replaced_cargo_free == (cargo_free_f)0x0) {
      free(group);
    }
    else {
      (*replaced_cargo_free)(group);
    }
  }
  s = &local_60;
  count = &local_78;
LAB_001089da:
  _cargo_free_str_list(s,count);
  return iVar5;
}

Assistant:

int cargo_add_optionv(cargo_t ctx, cargo_option_flags_t flags,
                         const char *optnames, const char *description,
                         const char *fmt, va_list ap)
{
    size_t optcount = 0;
    char **optname_list = NULL;
    int ret = -1;
    size_t i = 0;
    cargo_fmt_scanner_t s;
    cargo_opt_t *o = NULL;
    char *grpname = NULL;
    char *mutex_grpname = NULL;
    int nargs_is_set = 0;
    assert(ctx);

    CARGODBG(2, "-------- Add option \"%s\", \"%s\" --------\n", optnames, fmt);

    if ((
            (flags & CARGO_OPT_DEFAULT_LITERAL) ||
            (ctx->flags & CARGO_DEFAULT_LITERALS)
        )
        && !(ctx->flags & CARGO_AUTOCLEAN))
    {
        CARGODBG(1, "Option flag CARGO_OPT_DEFAULT_LITERAL or global flag "
                    "CARGO_DEFAULT_LITERALS must be "
                    "combined with the global flag CARGO_AUTOCLEAN "
                    "to avoid memory leak / crash.");
        return -1;
    }

    // TODO: Allow multiple mutex groups...
    if (!(optnames = _cargo_get_option_group_names(ctx, optnames,
                        &grpname, &mutex_grpname)))
    {
        CARGODBG(1, "Failed to parse group name\n");
        return -1;
    }

    CARGODBG(2, " Group: \"%s\", Optnames: \"%s\"\n", grpname, optnames);

    if (!(optname_list = _cargo_split_and_verify_option_names(ctx, optnames, &optcount)))
    {
        CARGODBG(1, "Failed to split option names \"%s\"\n", optnames);
        goto fail;
    }

    if (!(o = _cargo_option_init(ctx, optname_list[0], description)))
    {
        CARGODBG(1, "Failed to init option\n");
        goto fail;
    }

    if (grpname)
    {
        CARGODBG(2, "Add \"%s\" to group \"%s\"\n", o->name[0], grpname);

        if (cargo_group_add_option(ctx, grpname, o->name[0]))
        {
            CARGODBG(1, "Failed to add option \"%s\" to group \"%s\"\n",
                    o->name[0], grpname);
            goto fail;
        }
    }
    else
    {
        CARGODBG(2, "Add \"%s\" to default group\n", o->name[0]);
        o->group_index = -1;
    }

    if (mutex_grpname)
    {
        CARGODBG(2, "Add \"%s\" to mutex group \"%s\"\n", o->name[0], mutex_grpname);

        if (cargo_mutex_group_add_option(ctx, mutex_grpname, o->name[0]))
        {
            CARGODBG(1, "Failed to add option \"%s\" to mutex group \"%s\"",
                    o->name[0], mutex_grpname);
            goto fail;
        }
    }

    // Start parsing the format string.
    _cargo_fmt_scanner_init(&s, fmt);
    _cargo_fmt_next_token(&s);

    // Get the first token.
    if (_cargo_fmt_token(&s) == '.')
    {
        CARGODBG(2, "Static\n");
        o->alloc = 0;
        _cargo_fmt_next_token(&s);
    }
    else
    {
        o->alloc = 1;
    }

    if (_cargo_fmt_token(&s) == '[')
    {
        CARGODBG(4, "   [\n");
        o->array = 1;
        _cargo_fmt_next_token(&s);
    }

    switch (_cargo_fmt_token(&s))
    {
        //
        // !!!WARNING!!!
        // Do not attempt to refactor and put these longer cases in
        // separate functions. Passing a va_list around is dangerous.
        // This works fine on Unix, but fails randomly on Windows!
        //

        // Same as string, but the target is internal
        // and will be passed to the user specified callback.
        case 'c':
        {
            CARGODBG(4, "Custom callback\n");

            if (!o->alloc)
            {
                CARGODBG(1, "WARNING! Static '.' is ignored for a custom "
                            "callback the memory for the arguments is "
                            "allocated internally.");
                o->alloc = 1;
            }

            o->type = CARGO_STRING;
            o->custom = va_arg(ap, cargo_custom_f);
            o->custom_user = va_arg(ap, void *);

            // We use an internal target for custom variables, this will then
            // be passed on to the callback as argv and argc.
            o->target = (void **)&o->custom_target;
            o->target_count = &o->custom_target_count;

            o->lenstr = 0;

            if (!o->custom)
            {
                CARGODBG(2, "Warning: Got NULL custom callback pointer\n");
            }

            _cargo_fmt_next_token(&s);

            switch (_cargo_fmt_token(&s))
            {
                // A shortcut to "[c]#", cbfunc, NULL, NULL, 0.
                // which makes a custom callback a bool flag basically.
                case '0': o->nargs = 0; break;
                default:
                {
                    _cargo_fmt_prev_token(&s);
                    o->nargs = 1;
                    break;
                }
            }

            nargs_is_set = 1;

            break;
        }
        case 'D': // D as in Dummy.
        {
            // Shortcut for: "c0", NULL, NULL;
            // That is a dummy callback. This is mostly useful
            // for using in a mutex group.
            o->array = 0;
            o->alloc = 1;
            o->type = CARGO_STRING;
            o->custom = NULL;
            o->custom_user = NULL;
            o->lenstr = 0;
            o->nargs = 0;

            o->target = (void **)&o->custom_target;
            o->target_count = &o->custom_target_count;

            nargs_is_set = 1;
            break;
        }
        case 's':
        {
            o->type = CARGO_STRING;
            o->target = (void *)va_arg(ap, char *);

            CARGODBG(4, "Read string\n");
            _cargo_fmt_next_token(&s);

            if (_cargo_fmt_token(&s) == '#')
            {
                o->lenstr = (size_t)va_arg(ap, int);
                CARGODBG(4, "String length: %lu\n", o->lenstr);

                if (o->alloc)
                {
                    CARGODBG(1, "%s: WARNING! Usually restricting the size of a "
                        "string using # is only done on static strings.\n"
                        "    Are you sure you want this?\n",
                        o->name[0]);
                    CARGODBG(1, "      \"%s\"\n", s.start);
                    CARGODBG(1, "       %*s\n", s.column, "^");
                }
            }
            else
            {
                // String size not fixed.
                o->lenstr = 0;
                _cargo_fmt_prev_token(&s);
            }

            break;
        }
        case 'b':
        {
            o->type = CARGO_BOOL;
            o->target = va_arg(ap, void *);

            // Look for any modifier tokens.
            _cargo_fmt_next_token(&s);

            switch (_cargo_fmt_token(&s))
            {
                // Read an int that will be stored in the bool value (Default 1)
                case '=': o->bool_store = va_arg(ap, int); break;
                // Count flag occurances.
                case '!': o->bool_count = 1; break;
                case '|':
                case '+':
                case '&':
                case '_':
                {
                    switch (_cargo_fmt_token(&s))
                    {
                        default:
                        case '|': o->bool_acc_op = CARGO_BOOL_OP_OR; break;
                        case '+': o->bool_acc_op = CARGO_BOOL_OP_PLUS; break;
                        case '&': o->bool_acc_op = CARGO_BOOL_OP_AND; break;
                        case '_': o->bool_acc_op = CARGO_BOOL_OP_STORE; break;
                    }

                    o->bool_acc_count = 0;
                    o->bool_acc_max_count = (size_t)va_arg(ap, unsigned int);
                    CARGODBG(3, "Bool acc max count %lu\n", o->bool_acc_max_count);

                    if (!(o->bool_acc = _cargo_calloc(o->bool_acc_max_count, sizeof(int))))
                    {
                        CARGODBG(1, "Out of memory\n");
                        goto fail;
                    }

                    for (i = 0; i < o->bool_acc_max_count; i++)
                    {
                        o->bool_acc[i] = va_arg(ap, int);
                        CARGODBG(3, "  bool acc value %lu: 0x%x\n", i, o->bool_acc[i]);
                    }
                    break;
                }
                default:
                {
                    // Got no flag modifier token.
                    o->bool_store = 1;
                    o->bool_count = 0;
                    o->bool_acc = NULL;
                    _cargo_fmt_prev_token(&s);
                }
            }

            break;
        }
        // TODO: Maybe replace target here with a union?
        case 'i': o->type = CARGO_INT;    o->target = va_arg(ap, void *); break;
        case 'd': o->type = CARGO_DOUBLE; o->target = va_arg(ap, void *); break;
        case 'u': o->type = CARGO_UINT;   o->target = va_arg(ap, void *); break;
        case 'f': o->type = CARGO_FLOAT;  o->target = va_arg(ap, void *); break;
        case 'L': o->type = CARGO_LONGLONG;   o->target = va_arg(ap, void *); break;
        case 'U': o->type = CARGO_ULONGLONG;  o->target = va_arg(ap, void *); break;
        default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);goto fail;
    }

    if (o->array)
    {
        // Custom callbacks uses an internal target and count.
        // However we still return the count in a separate
        // user specified value for arrays.
        if (o->custom)
        {
            o->custom_user_count = va_arg(ap, size_t *);
        }
        else
        {
            // This is where we return the number of arguments
            // we have parsed for this option.
            o->target_count = va_arg(ap, size_t *);
        }

        _cargo_fmt_next_token(&s);

        if (_cargo_fmt_token(&s) != ']')
        {
            CARGODBG(1, "%s: Expected ']'\n", o->name[0]);
            CARGODBG(1, "      \"%s\"\n", fmt);
            CARGODBG(1, "        %*s\n", s.column, "^");
            goto fail;
        }

        _cargo_fmt_next_token(&s);

        if (o->alloc)
        {
            switch (_cargo_fmt_token(&s))
            {
                case '*': o->nargs = CARGO_NARGS_ZERO_OR_MORE; break;
                case '+': o->nargs = CARGO_NARGS_ONE_OR_MORE;  break;
                case 'N': // Fall through. Python uses N so lets allow that...
                case '#': o->nargs = va_arg(ap, int); break;
                default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
                        goto fail;
            }

            // By default "nargs" is the max number of arguments the option should parse.
            o->max_target_count = (o->nargs >= 0) ? o->nargs : (size_t)(-1);
        }
        else
        {
            assert(*fmt == '.');
            // If we have a static array. For example:
            // "int val[4];"
            // The max target count must still always be specified
            // if we use "+" or "*" when in static mode.
            o->max_target_count = va_arg(ap, int);

            switch (_cargo_fmt_token(&s))
            {
                case '*': o->nargs = CARGO_NARGS_ZERO_OR_MORE; break;
                case '+': o->nargs = CARGO_NARGS_ONE_OR_MORE;  break;
                case 'N': // Fall through. Python uses N so lets allow that...
                case '#': o->nargs = o->max_target_count; break;
                default: _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
                        goto fail;
            }
        }
    }
    else
    {
        // Non-array.

        if (o->type == CARGO_BOOL)
        {
            // BOOLs never have arguments.
            o->nargs = 0;
        }
        else
        {
            _cargo_fmt_next_token(&s);

            if (_cargo_fmt_token(&s) == '?')
            {
                o->nargs = CARGO_NARGS_ZERO_OR_ONE;
                o->zero_or_one_default = va_arg(ap, char *);
            }
            else
            {
                _cargo_fmt_prev_token(&s);

                if (!nargs_is_set)
                {
                    o->nargs = 1;
                }
            }
        }

        // Never allocate single values (unless it's a string).
        o->alloc = (o->type != CARGO_STRING) ? 0 : o->alloc;
        o->max_target_count = 1;
    }

    _cargo_fmt_next_token(&s);

    if (_cargo_fmt_token(&s) != '\0')
    {
        _cargo_invalid_format_char(ctx, o->name[0], fmt, &s);
        CARGODBG(1, "Got garbage at end of format string\n");
        goto fail;
    }

    o->flags = flags;
    o->first_parse = 1;

    // Check if the option has a prefix
    // (if not it's positional).
    o->positional = !_cargo_is_prefix(ctx, o->name[0][0]);

    if (o->positional
        && !(o->flags & CARGO_OPT_NOT_REQUIRED)
        && (o->nargs != CARGO_NARGS_ZERO_OR_MORE)
        && (o->nargs != CARGO_NARGS_ZERO_OR_ONE))
    {
        CARGODBG(2, "Positional argument %s required by default\n", o->name[0]);
        o->flags |= CARGO_OPT_REQUIRED;
    }

    if (_cargo_validate_option_args(ctx, o))
    {
        goto fail;
    }

    // .[s]#  .[s]+  .[s]*
    if ((o->type == CARGO_STRING)
         && (o->nargs != 1)
         && (o->lenstr == 0)
         && !o->alloc)
    {
        // A list of strings with a static size is a special case:
        //   char *strs[5];
        // Since we only want to allocate memory for the individual
        // strings we parse, but not the entire list (as with):
        //   char **strs;
        // The format string for this would be ".[s]#"
        //
        // nargs != 1 && nargs != -1:
        //   So we want nargs to be set, but not to infinite (-1),
        //   this means # was used.
        // lenstr == 0:
        //   .[s#]# would mean we have something like char strs[5][15];
        // !alloc:
        //   The list is not to be allocated.

        // So in this case we are not allocating the list itself
        // since that is of a fixed size. But we want to allocate
        // each individual item string.
        o->str_alloc_items = 1;
    }

    for (i = 1; i < optcount; i++)
    {
        if (cargo_add_alias(ctx, optname_list[0], optname_list[i]))
        {
            goto fail;
        }
    }

    CARGODBG(2, " Option %s:\n", o->name[0]);
    CARGODBG(2, "   max_target_count = %lu\n", o->max_target_count);
    CARGODBG(2, "   alloc = %d\n", o->alloc);
    CARGODBG(2, "   lenstr = %lu\n", o->lenstr);
    CARGODBG(2, "   nargs = %d\n", o->nargs);
    CARGODBG(2, "   positional = %d\n", o->positional);
    CARGODBG(2, "   array = %d\n", o->array);
    CARGODBG(2, "   \n");

    ret = 0;

fail:
    if (ret < 0)
    {
        if (o)
        {
            _cargo_option_destroy(o);
            ctx->opt_count--;
        }
    }

    _cargo_xfree(&grpname);
    _cargo_xfree(&mutex_grpname);
    _cargo_free_str_list(&optname_list, &optcount);

    return ret;
}